

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O0

lws * lws_create_adopt_udp
                (lws_vhost *vhost,char *ads,int port,int flags,char *protocol_name,char *ifname,
                lws *parent_wsi,void *opaque,lws_retry_bo_t *retry_policy)

{
  int __ecode;
  lws *plVar1;
  char *pcVar2;
  char *local_a0;
  char local_98 [8];
  char buf [16];
  undefined1 local_80 [8];
  addrinfo h;
  addrinfo *r;
  int n;
  lws *wsi;
  char *ifname_local;
  char *protocol_name_local;
  int flags_local;
  int port_local;
  char *ads_local;
  lws_vhost *vhost_local;
  
  local_a0 = ads;
  if (ads == (char *)0x0) {
    local_a0 = "null";
  }
  _lws_log(8,"%s: %s:%u\n","lws_create_adopt_udp",local_a0,(ulong)(uint)port);
  plVar1 = lws_adopt_descriptor_vhost1
                     (vhost,LWS_ADOPT_RAW_SOCKET_UDP,protocol_name,parent_wsi,opaque);
  if (plVar1 == (lws *)0x0) {
    _lws_log(1,"%s: udp wsi creation failed\n","lws_create_adopt_udp");
  }
  else {
    *(ulong *)&plVar1->field_0x2dc =
         *(ulong *)&plVar1->field_0x2dc & 0xffffff7fffffffff | (ulong)((flags & 1U) != 0) << 0x27;
    *(ulong *)&plVar1->field_0x2dc =
         *(ulong *)&plVar1->field_0x2dc & 0xfffffffffffffbff | (ulong)((flags & 2U) != 0) << 10;
    *(ulong *)&plVar1->field_0x2dc =
         *(ulong *)&plVar1->field_0x2dc & 0xfffffffffffffdff | (ulong)((flags & 4U) != 0) << 9;
    plVar1->c_port = (uint16_t)port;
    if (retry_policy == (lws_retry_bo_t *)0x0) {
      plVar1->retry_policy = vhost->retry_policy;
    }
    else {
      plVar1->retry_policy = retry_policy;
    }
    memset(local_80,0,0x30);
    local_80._4_4_ = 0;
    h.ai_flags = 2;
    h.ai_family = 0x11;
    local_80._0_4_ = 0x21;
    lws_snprintf(local_98,0x10,"%u",(ulong)(uint)port);
    __ecode = getaddrinfo(ads,local_98,(addrinfo *)local_80,(addrinfo **)&h.ai_next);
    if (__ecode == 0) {
      plVar1 = lws_create_adopt_udp2(plVar1,ads,h.ai_next,0,(void *)0x0);
      return plVar1;
    }
    pcVar2 = gai_strerror(__ecode);
    _lws_log(8,"%s: getaddrinfo error: %s\n","lws_create_adopt_udp",pcVar2);
    lws_close_free_wsi(plVar1,LWS_CLOSE_STATUS_NOSTATUS,"adopt udp2 fail");
  }
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_create_adopt_udp(struct lws_vhost *vhost, const char *ads, int port,
		     int flags, const char *protocol_name, const char *ifname,
		     struct lws *parent_wsi, void *opaque,
		     const lws_retry_bo_t *retry_policy)
{
#if !defined(LWS_PLAT_OPTEE)
	struct lws *wsi;
	int n;

	lwsl_info("%s: %s:%u\n", __func__, ads ? ads : "null", port);

	/* create the logical wsi without any valid fd */

	wsi = lws_adopt_descriptor_vhost1(vhost, LWS_ADOPT_RAW_SOCKET_UDP,
					  protocol_name, parent_wsi, opaque);
	if (!wsi) {
		lwsl_err("%s: udp wsi creation failed\n", __func__);
		goto bail;
	}
	wsi->do_bind = !!(flags & LWS_CAUDP_BIND);
	wsi->do_broadcast = !!(flags & LWS_CAUDP_BROADCAST);
	wsi->pf_packet = !!(flags & LWS_CAUDP_PF_PACKET);
	wsi->c_port = port;
	if (retry_policy)
		wsi->retry_policy = retry_policy;
	else
		wsi->retry_policy = vhost->retry_policy;

#if !defined(LWS_WITH_SYS_ASYNC_DNS)
	{
		struct addrinfo *r, h;
		char buf[16];

		memset(&h, 0, sizeof(h));
		h.ai_family = AF_UNSPEC;    /* Allow IPv4 or IPv6 */
		h.ai_socktype = SOCK_DGRAM;
		h.ai_protocol = IPPROTO_UDP;
		h.ai_flags = AI_PASSIVE;
#ifdef AI_ADDRCONFIG
		h.ai_flags |= AI_ADDRCONFIG;
#endif

		/* if the dns lookup is synchronous, do the whole thing now */
		lws_snprintf(buf, sizeof(buf), "%u", port);
		n = getaddrinfo(ads, buf, &h, &r);
		if (n) {
#if !defined(LWS_PLAT_FREERTOS)
			lwsl_info("%s: getaddrinfo error: %s\n", __func__,
				  gai_strerror(n));
#else
			lwsl_info("%s: getaddrinfo error: %s\n", __func__,
					strerror(n));
#endif
			//freeaddrinfo(r);
			goto bail1;
		}
		/* complete it immediately after the blocking dns lookup
		 * finished... free r when connect either completed or failed */
		wsi = lws_create_adopt_udp2(wsi, ads, r, 0, NULL);

		return wsi;
	}
#else
	if (ads) {
		/*
		 * with async dns, use the wsi as the point about which to do
		 * the dns lookup and have it call the second part when it's
		 * done.
		 *
		 * Keep a refcount on the results and free it when we connected
		 * or definitively failed.
		 *
		 * Notice wsi has no socket at this point (we don't know what
		 * kind to ask for until we get the dns back).  But it is bound
		 * to a vhost and can be cleaned up from that at vhost destroy.
		 */
		n = lws_async_dns_query(vhost->context, 0, ads,
					LWS_ADNS_RECORD_A,
					lws_create_adopt_udp2, wsi, (void *)ifname);
		lwsl_debug("%s: dns query returned %d\n", __func__, n);
		if (n == LADNS_RET_FAILED) {
			lwsl_err("%s: async dns failed\n", __func__);
			wsi = NULL;
			/*
			 * It was already closed by calling callback with error
			 * from lws_async_dns_query()
			 */
			goto bail;
		}
	} else {
		lwsl_debug("%s: udp adopt has no ads\n", __func__);
		wsi = lws_create_adopt_udp2(wsi, ads, NULL, 0, (void *)ifname);
	}

	/* dns lookup is happening asynchronously */

	lwsl_debug("%s: returning wsi %p\n", __func__, wsi);
	return wsi;
#endif
#if !defined(LWS_WITH_SYS_ASYNC_DNS)
bail1:
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "adopt udp2 fail");
	wsi = NULL;
#endif
bail:
	return wsi;
#else
	return NULL;
#endif
}